

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O0

bool __thiscall
Shell::Options::ChoiceOptionValue<Shell::Options::FunctionDefinitionElimination>::setValue
          (ChoiceOptionValue<Shell::Options::FunctionDefinitionElimination> *this,string *value)

{
  int iVar1;
  string *value_00;
  OptionChoiceValues *this_00;
  long in_RDI;
  int index;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  value_00 = (string *)(in_RDI + 0xe0);
  this_00 = (OptionChoiceValues *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  iVar1 = OptionChoiceValues::find(this_00,value_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  if (-1 < iVar1) {
    *(int *)(in_RDI + 0x98) = iVar1;
  }
  return -1 < iVar1;
}

Assistant:

bool setValue(const std::string& value){
            // makes reasonable assumption about ordering of every enum
            int index = choices.find(value.c_str());
            if(index<0) return false;
            this->actualValue = static_cast<T>(index);
            return true;
        }